

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc_global.h
# Opt level: O2

int Abc_PrimeCudd(uint p)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar5 = p - 1;
  do {
    do {
      uVar6 = uVar5 + 1;
      uVar2 = uVar5 & 1;
      uVar5 = uVar6;
    } while (uVar2 != 0);
    uVar4 = 3;
    do {
      iVar3 = (int)uVar4;
      if (uVar6 < (uint)(iVar3 * iVar3)) {
        return uVar6;
      }
      uVar1 = (ulong)uVar6 % uVar4;
      uVar4 = (ulong)(iVar3 + 2);
    } while ((int)uVar1 != 0);
  } while( true );
}

Assistant:

static inline int Abc_PrimeCudd( unsigned int p )
{
    int i,pn;
    p--;
    do {
        p++;
        if (p&1)
        {
            pn = 1;
            i = 3;
            while ((unsigned) (i * i) <= p)
            {
                if (p % i == 0) {
                    pn = 0;
                    break;
                }
                i += 2;
            }
        }
        else
            pn = 0;
    } while (!pn);
    return(p);

}